

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_internal.h
# Opt level: O3

optional<unsigned_int> __thiscall absl::lts_20240722::Cord::ExpectedChecksum(Cord *this)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  if ((((this->contents_).data_.rep_.field_0.data[0] & 1U) == 0) ||
     (((this->contents_).data_.rep_.field_0.as_tree.rep)->tag != '\x02')) {
    uVar2 = 0;
    uVar3 = 0;
  }
  else {
    uVar1 = absl::lts_20240722::crc_internal::CrcCordState::Checksum();
    uVar2 = (ulong)uVar1;
    uVar3 = 0x100000000;
  }
  return (optional<unsigned_int>)(uVar2 | uVar3);
}

Assistant:

bool is_tree() const { return (rep_.tag() & 1) != 0; }